

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* evaluation_speed_test_abi_cxx11_
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *__return_storage_ptr__,ChebyshevExpansion *cee,vectype *xpts,long N)

{
  mapped_type *pmVar1;
  Index IVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  rep rVar5;
  double dVar6;
  allocator<char> local_1b1;
  key_type local_1b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_190;
  duration<double,_std::ratio<1L,_1L>_> local_188;
  double local_180;
  int local_178;
  int local_174;
  int n_1;
  int i_3;
  allocator<char> local_161;
  key_type local_160;
  duration<long,_std::ratio<1L,_1000000000L>_> local_140;
  duration<double,_std::ratio<1L,_1L>_> local_138;
  double local_130;
  int local_128;
  int local_124;
  int n;
  int i_2;
  allocator<char> local_111;
  key_type local_110;
  duration<long,_std::ratio<1L,_1000000000L>_> local_f0;
  duration<double,_std::ratio<1L,_1L>_> local_e8;
  double local_e0;
  undefined1 local_d8 [28];
  int i_1;
  allocator<char> local_b1;
  key_type local_b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_90;
  duration<double,_std::ratio<1L,_1L>_> local_88;
  double local_80;
  double elap_us;
  time_point endTime;
  int local_5c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_58;
  int i;
  time_point startTime;
  undefined1 local_40 [8];
  vectype ypts;
  long N_local;
  vectype *xpts_local;
  ChebyshevExpansion *cee_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *output;
  
  ypts.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._7_1_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(__return_storage_ptr__);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  tStack_58.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_5c = 0; local_5c < N; local_5c = local_5c + 1) {
    ChebTools::ChebyshevExpansion::y_recurrence_xscaled((ChebyshevExpansion *)&endTime,&cee->m_c);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,
               (Matrix<double,__1,_1,_0,__1,_1> *)&endTime);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&endTime);
  }
  elap_us = (double)std::chrono::_V2::system_clock::now();
  local_90.__r = (rep_conflict)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&elap_us,&stack0xffffffffffffffa8);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_88,&local_90);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_88);
  dVar6 = (rVar5 / (double)N) * 1000000.0;
  local_80 = dVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"recurrence[vector]",&local_b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](__return_storage_ptr__,&local_b0);
  *pmVar1 = dVar6;
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  register0x00000000 = std::chrono::_V2::system_clock::now();
  tStack_58.__d.__r = (duration)(duration)register0x00000000;
  for (local_d8._20_4_ = 0; (int)local_d8._20_4_ < N; local_d8._20_4_ = local_d8._20_4_ + 1) {
    ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled((ChebyshevExpansion *)local_d8,&cee->m_c);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_d8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_d8);
  }
  local_e0 = (double)std::chrono::_V2::system_clock::now();
  elap_us = local_e0;
  local_f0.__r = (rep_conflict)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&elap_us,&stack0xffffffffffffffa8);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_e8,&local_f0);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_e8);
  dVar6 = (rVar5 / (double)N) * 1000000.0;
  local_80 = dVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Clenshaw[vector]",&local_111);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](__return_storage_ptr__,&local_110);
  *pmVar1 = dVar6;
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  _n = std::chrono::_V2::system_clock::now();
  tStack_58.__d.__r = (duration)(duration)_n;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xpts);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40,IVar2);
  for (local_124 = 0; local_124 < N; local_124 = local_124 + 1) {
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xpts);
    local_128 = (int)IVar2;
    while (local_128 = local_128 + -1, -1 < local_128) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)xpts,
                          (long)local_128);
      dVar6 = ChebTools::ChebyshevExpansion::y_recurrence(cee,*pdVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                          (long)local_128);
      *pSVar4 = dVar6;
    }
  }
  local_130 = (double)std::chrono::_V2::system_clock::now();
  elap_us = local_130;
  local_140.__r =
       (rep_conflict)
       std::chrono::operator-
                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&elap_us,&stack0xffffffffffffffa8);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_138,&local_140);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_138);
  dVar6 = (rVar5 / (double)N) * 1000000.0;
  local_80 = dVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"recurrence[1x1]",&local_161);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](__return_storage_ptr__,&local_160);
  *pmVar1 = dVar6;
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  _n_1 = std::chrono::_V2::system_clock::now();
  tStack_58.__d.__r = (duration)(duration)_n_1;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xpts);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40,IVar2);
  for (local_174 = 0; local_174 < N; local_174 = local_174 + 1) {
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xpts);
    local_178 = (int)IVar2;
    while (local_178 = local_178 + -1, -1 < local_178) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)xpts,
                          (long)local_178);
      dVar6 = ChebTools::ChebyshevExpansion::y_Clenshaw(cee,*pdVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                          (long)local_178);
      *pSVar4 = dVar6;
    }
  }
  local_180 = (double)std::chrono::_V2::system_clock::now();
  elap_us = local_180;
  local_190.__r =
       (rep_conflict)
       std::chrono::operator-
                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&elap_us,&stack0xffffffffffffffa8);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_188,&local_190);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_188);
  dVar6 = (rVar5 / (double)N) * 1000000.0;
  local_80 = dVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Clenshaw[1x1]",&local_1b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](__return_storage_ptr__,&local_1b0);
  *pmVar1 = dVar6;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  ypts.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._7_1_ = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  if ((ypts.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._7_1_ &
      1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~map(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, double> evaluation_speed_test(ChebyshevExpansion &cee, const vectype &xpts, long N) {
    std::map<std::string, double> output;
    vectype ypts;

    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_recurrence_xscaled(xpts);
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_Clenshaw_xscaled(xpts);
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_recurrence(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[1x1]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_Clenshaw(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[1x1]"] = elap_us;
    return output;
}